

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChProfiler.cpp
# Opt level: O1

void __thiscall chrono::utils::ChProfileNode::Reset(ChProfileNode *this)

{
  do {
    this->TotalCalls = 0;
    this->TotalTime = 0.0;
    if (this->Child != (ChProfileNode *)0x0) {
      Reset(this->Child);
    }
    this = this->Sibling;
  } while (this != (ChProfileNode *)0x0);
  return;
}

Assistant:

void	ChProfileNode::Reset( void )
{
	TotalCalls = 0;
	TotalTime = 0.0f;
	

	if ( Child ) {
		Child->Reset();
	}
	if ( Sibling ) {
		Sibling->Reset();
	}
}